

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

bool __thiscall
google::
dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
::serialize<ValueSerializer,_IO_FILE>
          (dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
           *this,FILE *param_2)

{
  bool bVar1;
  size_t sVar2;
  int bit_1;
  undefined8 unaff_RBP;
  ulong uVar3;
  long lVar4;
  byte bVar5;
  int bit;
  long lVar6;
  ulong uVar7;
  byte local_3e;
  ValueSerializer local_3d;
  uint local_3c;
  long local_38;
  
  dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                    *)this);
  bVar1 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                    ((_IO_FILE *)param_2,0x13578642,4);
  if (((bVar1) &&
      (bVar1 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                         ((_IO_FILE *)param_2,*(unsigned_long *)(this + 0x90),8), bVar1)) &&
     (bVar1 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                        ((_IO_FILE *)param_2,*(unsigned_long *)(this + 0x88),8), bVar1)) {
    uVar3 = CONCAT71((int7)((ulong)unaff_RBP >> 8),*(long *)(this + 0x90) == 0);
    if (*(long *)(this + 0x90) != 0) {
      local_38 = 0;
      uVar7 = 0;
      do {
        local_3e = 0;
        lVar6 = 0;
        bVar5 = 0;
        do {
          if ((uVar7 + lVar6 < *(ulong *)(this + 0x90)) &&
             (bVar1 = dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                      ::test_empty((dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                                    *)this,uVar7 + lVar6), !bVar1)) {
            bVar5 = bVar5 | (byte)(1 << ((byte)lVar6 & 0x1f));
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 8);
        local_3c = (uint)uVar3;
        local_3e = bVar5;
        sVar2 = fwrite(&local_3e,1,1,param_2);
        bVar5 = local_3e;
        if (sVar2 != 1) {
LAB_009818ad:
          uVar3 = (ulong)local_3c;
          break;
        }
        lVar4 = 0;
        lVar6 = local_38;
        do {
          if (((bVar5 >> ((uint)lVar4 & 0x1f) & 1) != 0) &&
             (bVar1 = ValueSerializer::operator()
                                (&local_3d,(FILE *)param_2,
                                 (string *)(*(long *)(this + 0xa8) + lVar6)), !bVar1))
          goto LAB_009818ad;
          lVar4 = lVar4 + 1;
          lVar6 = lVar6 + 0x20;
        } while (lVar4 != 8);
        uVar7 = uVar7 + 8;
        local_38 = local_38 + 0x100;
        uVar3 = (ulong)(uVar7 >= *(ulong *)(this + 0x90));
      } while (uVar7 < *(ulong *)(this + 0x90));
    }
  }
  else {
    uVar3 = 0;
  }
  return (bool)((byte)uVar3 & 1);
}

Assistant:

bool serialize(ValueSerializer serializer, OUTPUT* fp) {
    squash_deleted();  // so we don't have to worry about delkey
    if (!sparsehash_internal::write_bigendian_number(fp, MAGIC_NUMBER, 4))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_buckets, 8))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_elements, 8))
      return false;
    // Now write a bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits = 0;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && !test_empty(i + bit)) bits |= (1 << bit);
      }
      if (!sparsehash_internal::write_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (bits & (1 << bit)) {
          if (!serializer(fp, table[i + bit])) return false;
        }
      }
    }
    return true;
  }